

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O0

void __thiscall
vkt::QueryPool::anon_unknown_0::StateObjects::setVertices
          (StateObjects *this,DeviceInterface *vk,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertices)

{
  Vec4 *device_00;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vkd;
  Buffer *pBVar1;
  Vector<float,_4> *pVVar2;
  VkDeviceSize offset;
  size_type sVar3;
  Allocation local_b8;
  Allocation local_98;
  VkDeviceMemory local_78;
  Vector<float,_4> *local_70;
  __normal_iterator<tcu::Vector<float,_4>_*,_std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>_>
  local_68;
  Allocation local_50;
  Vector<float,_4> *local_30;
  Vec4 *ptr;
  VkDevice device;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertices_local;
  DeviceInterface *vk_local;
  StateObjects *this_local;
  
  device = (VkDevice)vertices;
  vertices_local = (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)vk;
  vk_local = (DeviceInterface *)this;
  ptr = (Vec4 *)Context::getDevice(this->m_context);
  pBVar1 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_vertexBuffer);
  Draw::Buffer::getBoundMemory(&local_50,pBVar1);
  pVVar2 = (Vector<float,_4> *)::vk::Allocation::getHostPtr(&local_50);
  ::vk::Allocation::~Allocation(&local_50);
  local_30 = pVVar2;
  local_68._M_current =
       (Vector<float,_4> *)
       std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::begin(vertices);
  local_70 = (Vector<float,_4> *)
             std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::end
                       (vertices);
  std::
  copy<__gnu_cxx::__normal_iterator<tcu::Vector<float,4>*,std::vector<tcu::Vector<float,4>,std::allocator<tcu::Vector<float,4>>>>,tcu::Vector<float,4>*>
            (local_68,(__normal_iterator<tcu::Vector<float,_4>_*,_std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>_>
                       )local_70,local_30);
  vkd = vertices_local;
  device_00 = ptr;
  pBVar1 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_vertexBuffer);
  Draw::Buffer::getBoundMemory(&local_98,pBVar1);
  local_78 = ::vk::Allocation::getMemory(&local_98);
  pBVar1 = de::SharedPtr<vkt::Draw::Buffer>::operator->(&this->m_vertexBuffer);
  Draw::Buffer::getBoundMemory(&local_b8,pBVar1);
  offset = ::vk::Allocation::getOffset(&local_b8);
  sVar3 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                    (vertices);
  ::vk::flushMappedMemoryRange
            ((DeviceInterface *)vkd,(VkDevice)device_00,local_78,offset,sVar3 << 4);
  ::vk::Allocation::~Allocation(&local_b8);
  ::vk::Allocation::~Allocation(&local_98);
  return;
}

Assistant:

void StateObjects::setVertices (const vk::DeviceInterface&vk, std::vector<tcu::Vec4> vertices)
{
	const vk::VkDevice device			= m_context.getDevice();

	tcu::Vec4 *ptr = reinterpret_cast<tcu::Vec4*>(m_vertexBuffer->getBoundMemory().getHostPtr());
	std::copy(vertices.begin(), vertices.end(), ptr);

	vk::flushMappedMemoryRange(vk, device,	m_vertexBuffer->getBoundMemory().getMemory(), m_vertexBuffer->getBoundMemory().getOffset(),	vertices.size() * sizeof(vertices[0]));
}